

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::FenceVkImpl::Signal(FenceVkImpl *this,Uint64 Value)

{
  bool bVar1;
  VkResult VVar2;
  Char *pCVar3;
  VulkanLogicalDevice *this_00;
  undefined1 local_b8 [8];
  string msg_2;
  string msg_1;
  VkResult err;
  VulkanLogicalDevice *LogicalDevice;
  VkSemaphoreSignalInfo SignalInfo;
  undefined1 local_38 [8];
  string msg;
  Uint64 Value_local;
  FenceVkImpl *this_local;
  
  msg.field_2._8_8_ = Value;
  if ((this->super_FenceBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>.
      m_Desc.Type != FENCE_TYPE_GENERAL) {
    FormatString<char[53]>
              ((string *)local_38,
               (char (*) [53])"Fence must have been created with FENCE_TYPE_GENERAL");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"Signal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0x99);
    std::__cxx11::string::~string((string *)local_38);
  }
  bVar1 = IsTimelineSemaphore(this);
  if (bVar1) {
    FenceBase<Diligent::EngineVkImplTraits>::DvpSignal
              (&this->super_FenceBase<Diligent::EngineVkImplTraits>,msg.field_2._8_8_);
    memset(&LogicalDevice,0,0x20);
    LogicalDevice._0_4_ = 0x3b9df29d;
    SignalInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    SignalInfo._4_4_ = 0;
    SignalInfo.pNext =
         VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkSemaphore_T_
                   ((VulkanObjectWrapper *)&this->m_TimelineSemaphore);
    SignalInfo.semaphore = (VkSemaphore)msg.field_2._8_8_;
    this_00 = RenderDeviceVkImpl::GetLogicalDevice
                        ((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                         .m_pDevice);
    VVar2 = VulkanUtilities::VulkanLogicalDevice::SignalSemaphore
                      (this_00,(VkSemaphoreSignalInfo *)&LogicalDevice);
    if (VVar2 != VK_SUCCESS) {
      FormatString<char[36]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [36])"Failed to signal timeline semaphore");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"Signal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0xaa);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
  }
  else {
    FormatString<char[89]>
              ((string *)local_b8,
               (char (*) [89])
               "Signal() is supported only with timeline semaphore, enable NativeFence feature to use it"
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"Signal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0xae);
    std::__cxx11::string::~string((string *)local_b8);
  }
  return;
}

Assistant:

void FenceVkImpl::Signal(Uint64 Value)
{
    DEV_CHECK_ERR(m_Desc.Type == FENCE_TYPE_GENERAL, "Fence must have been created with FENCE_TYPE_GENERAL");

    if (IsTimelineSemaphore())
    {
        DvpSignal(Value);

        // SignalSemaphore() is thread safe

        VkSemaphoreSignalInfo SignalInfo{};
        SignalInfo.sType     = VK_STRUCTURE_TYPE_SEMAPHORE_SIGNAL_INFO;
        SignalInfo.pNext     = nullptr;
        SignalInfo.semaphore = m_TimelineSemaphore;
        SignalInfo.value     = Value;

        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

        VkResult err = LogicalDevice.SignalSemaphore(SignalInfo);
        DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to signal timeline semaphore");
    }
    else
    {
        DEV_ERROR("Signal() is supported only with timeline semaphore, enable NativeFence feature to use it");
    }
}